

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O1

ostream * operator<<(ostream *os,vector_<char> *vector)

{
  ostream *poVar1;
  ulong uVar2;
  char local_29;
  
  if (vector->_size != 0) {
    uVar2 = 0;
    do {
      local_29 = (vector->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar2];
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < vector->_size);
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector_ &vector) {
        for (int i = 0; i < vector._size; i++) {
            os << vector.arr[i] << " ";
        }
        return os;
    }